

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall ExprTest_ImplicationExpr_Test::TestBody(ExprTest_ImplicationExpr_Test *this)

{
  LogicalExpr else_expr_00;
  LogicalExpr else_expr_01;
  LogicalExpr else_expr_02;
  LogicalExpr else_expr_03;
  LogicalExpr condition_00;
  LogicalExpr condition_01;
  LogicalExpr condition_02;
  LogicalExpr condition_03;
  bool bVar1;
  long in_RDI;
  AssertionFailure *e_2;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_5;
  AssertionFailure *e_1;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  LogicalConstant else_expr;
  LogicalConstant then_expr;
  LogicalConstant condition;
  AssertionResult gtest_ar_;
  ImplicationExpr e;
  undefined7 in_stack_fffffffffffffb98;
  undefined1 in_stack_fffffffffffffb9f;
  AssertionResult *in_stack_fffffffffffffba0;
  type_conflict tVar2;
  BasicExprFactory<std::allocator<char>_> *in_stack_fffffffffffffba8;
  ExprBase in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb8;
  int in_stack_fffffffffffffbbc;
  ExprBase in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc8;
  Type in_stack_fffffffffffffbcc;
  AssertionResult *in_stack_fffffffffffffbd0;
  char *in_stack_fffffffffffffbd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe0;
  char *in_stack_fffffffffffffc00;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffc08;
  undefined1 in_stack_fffffffffffffc0f;
  char *in_stack_fffffffffffffc10;
  AssertionResult *in_stack_fffffffffffffc18;
  AssertHelper *in_stack_fffffffffffffc20;
  allocator<char> local_261;
  string local_260 [32];
  AssertionResult local_240 [3];
  int local_20c;
  BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65> local_208;
  Impl *local_200;
  Impl *local_1f0;
  byte local_1d2;
  allocator<char> local_1d1;
  string local_1d0 [32];
  AssertionResult local_1b0 [2];
  ExprBase local_190;
  AssertionResult local_188 [2];
  ExprBase local_168;
  AssertionResult local_160 [2];
  ExprBase local_140;
  AssertionResult local_138 [2];
  Kind local_118;
  undefined4 local_114;
  AssertionResult local_110;
  string local_100 [48];
  AssertionResult local_d0;
  Impl *local_c0;
  Impl *local_b0;
  Impl *local_a0;
  BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65> local_90;
  ExprBase local_88;
  ExprBase local_80;
  ExprBase local_78;
  string local_70 [64];
  AssertionResult local_30;
  Impl *local_20;
  ExprBase local_10 [2];
  
  mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>::
  BasicIfExpr((BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>
               *)0x12c534);
  local_20 = local_10[0].impl_;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffba8,
             (BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>
             )in_stack_fffffffffffffbb0.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffba0 >> 0x20));
  mp::internal::ExprBase::operator_cast_to_function_pointer(local_10);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffba0,(bool)in_stack_fffffffffffffb9f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_30);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbd0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
               (char *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
               in_stack_fffffffffffffc00);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc,
               (char *)in_stack_fffffffffffffbc0.impl_,in_stack_fffffffffffffbbc,
               (char *)in_stack_fffffffffffffbb0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc20,(Message *)in_stack_fffffffffffffc18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffba0);
    std::__cxx11::string::~string(local_70);
    testing::Message::~Message((Message *)0x12c67c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12c6f7);
  local_78.impl_ =
       (Impl *)mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant
                         (in_stack_fffffffffffffba8,
                          SUB81((ulong)in_stack_fffffffffffffba0 >> 0x38,0));
  local_80.impl_ =
       (Impl *)mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant
                         (in_stack_fffffffffffffba8,
                          SUB81((ulong)in_stack_fffffffffffffba0 >> 0x38,0));
  local_88.impl_ =
       (Impl *)mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant
                         (in_stack_fffffffffffffba8,
                          SUB81((ulong)in_stack_fffffffffffffba0 >> 0x38,0));
  local_a0 = local_78.impl_;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffba8,
             (LogicalConstant)in_stack_fffffffffffffbb0.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffba0 >> 0x20));
  local_b0 = local_80.impl_;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffba8,
             (LogicalConstant)in_stack_fffffffffffffbb0.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffba0 >> 0x20));
  local_c0 = local_88.impl_;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffba8,
             (LogicalConstant)in_stack_fffffffffffffbb0.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffba0 >> 0x20));
  condition_00.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffbcc;
  condition_00.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffbc8;
  else_expr_00.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffbbc;
  else_expr_00.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffbb8;
  local_90.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeImplication
                 ((BasicExprFactory<std::allocator<char>_> *)in_stack_fffffffffffffbb0.impl_,
                  condition_00,(LogicalExpr)in_stack_fffffffffffffbc0.impl_,else_expr_00);
  local_10[0].impl_ = (Impl *)local_90.super_ExprBase.impl_;
  mp::internal::ExprBase::operator_cast_to_function_pointer(local_10);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffba0,(bool)in_stack_fffffffffffffb9f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbd0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
               (char *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
               in_stack_fffffffffffffc00);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc,
               (char *)in_stack_fffffffffffffbc0.impl_,in_stack_fffffffffffffbbc,
               (char *)in_stack_fffffffffffffbb0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc20,(Message *)in_stack_fffffffffffffc18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffba0);
    std::__cxx11::string::~string(local_100);
    testing::Message::~Message((Message *)0x12c946);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12c9c1);
  local_114 = 0x41;
  local_118 = mp::internal::ExprBase::kind((ExprBase *)0x12c9d9);
  testing::internal::EqHelper<false>::Compare<mp::expr::Kind,mp::expr::Kind>
            ((char *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
             (char *)in_stack_fffffffffffffbb0.impl_,(Kind *)in_stack_fffffffffffffba8,
             (Kind *)in_stack_fffffffffffffba0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_110);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbd0);
    testing::AssertionResult::failure_message((AssertionResult *)0x12ca82);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc,
               (char *)in_stack_fffffffffffffbc0.impl_,in_stack_fffffffffffffbbc,
               (char *)in_stack_fffffffffffffbb0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc20,(Message *)in_stack_fffffffffffffc18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffba0);
    testing::Message::~Message((Message *)0x12cae5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12cb3a);
  local_140.impl_ =
       (Impl *)mp::
               BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>
               ::condition((BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>
                            *)CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
  testing::internal::EqHelper<false>::
  Compare<mp::LogicalConstant,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            ((char *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
             (char *)in_stack_fffffffffffffbb0.impl_,(LogicalConstant *)in_stack_fffffffffffffba8,
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffba0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_138);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbd0);
    testing::AssertionResult::failure_message((AssertionResult *)0x12cbf1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc,
               (char *)in_stack_fffffffffffffbc0.impl_,in_stack_fffffffffffffbbc,
               (char *)in_stack_fffffffffffffbb0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc20,(Message *)in_stack_fffffffffffffc18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffba0);
    testing::Message::~Message((Message *)0x12cc54);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12cca9);
  local_168.impl_ =
       (Impl *)mp::
               BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>
               ::then_expr((BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>
                            *)CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
  testing::internal::EqHelper<false>::
  Compare<mp::LogicalConstant,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            ((char *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
             (char *)in_stack_fffffffffffffbb0.impl_,(LogicalConstant *)in_stack_fffffffffffffba8,
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffba0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_160);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbd0);
    testing::AssertionResult::failure_message((AssertionResult *)0x12cd60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc,
               (char *)in_stack_fffffffffffffbc0.impl_,in_stack_fffffffffffffbbc,
               (char *)in_stack_fffffffffffffbb0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc20,(Message *)in_stack_fffffffffffffc18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffba0);
    testing::Message::~Message((Message *)0x12cdc3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12ce18);
  local_190.impl_ =
       (Impl *)mp::
               BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>
               ::else_expr((BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>
                            *)CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
  testing::internal::EqHelper<false>::
  Compare<mp::LogicalConstant,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            ((char *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
             (char *)in_stack_fffffffffffffbb0.impl_,(LogicalConstant *)in_stack_fffffffffffffba8,
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffba0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_188);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbd0);
    testing::AssertionResult::failure_message((AssertionResult *)0x12cecf);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc,
               (char *)in_stack_fffffffffffffbc0.impl_,in_stack_fffffffffffffbbc,
               (char *)in_stack_fffffffffffffbb0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc20,(Message *)in_stack_fffffffffffffc18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffba0);
    testing::Message::~Message((Message *)0x12cf32);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12cf8a);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1b0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
               (allocator<char> *)in_stack_fffffffffffffbd0);
    std::allocator<char>::~allocator(&local_1d1);
    local_1d2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr
                ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)0x12d04c);
      local_1f0 = local_80.impl_;
      mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
                ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffba8,
                 (LogicalConstant)in_stack_fffffffffffffbb0.impl_,
                 (type_conflict)((ulong)in_stack_fffffffffffffba0 >> 0x20));
      local_200 = local_88.impl_;
      mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
                ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffba8,
                 (LogicalConstant)in_stack_fffffffffffffbb0.impl_,
                 (type_conflict)((ulong)in_stack_fffffffffffffba0 >> 0x20));
      condition_01.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffbcc;
      condition_01.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffbc8;
      else_expr_01.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffbbc;
      else_expr_01.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffbb8;
      local_208.super_ExprBase.impl_ =
           (ExprBase)
           mp::BasicExprFactory<std::allocator<char>_>::MakeImplication
                     ((BasicExprFactory<std::allocator<char>_> *)in_stack_fffffffffffffbb0.impl_,
                      condition_01,(LogicalExpr)in_stack_fffffffffffffbc0.impl_,else_expr_01);
    }
    if ((local_1d2 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffbd0,
                 (char (*) [148])CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      local_20c = 2;
    }
    else {
      local_20c = 0;
    }
    std::__cxx11::string::~string(local_1d0);
    if (local_20c != 0) goto LAB_0012d3ae;
  }
  else {
LAB_0012d3ae:
    testing::Message::Message((Message *)in_stack_fffffffffffffbd0);
    testing::AssertionResult::failure_message((AssertionResult *)0x12d3ca);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc,
               (char *)in_stack_fffffffffffffbc0.impl_,in_stack_fffffffffffffbbc,
               (char *)in_stack_fffffffffffffbb0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc20,(Message *)in_stack_fffffffffffffc18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffba0);
    testing::Message::~Message((Message *)0x12d427);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12d47f);
  this_00 = local_240;
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
               (allocator<char> *)in_stack_fffffffffffffbd0);
    std::allocator<char>::~allocator(&local_261);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
                ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffba8,
                 (LogicalConstant)in_stack_fffffffffffffbb0.impl_,
                 (type_conflict)((ulong)in_stack_fffffffffffffba0 >> 0x20));
      mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr
                ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)0x12d54f);
      mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
                ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffba8,
                 (LogicalConstant)in_stack_fffffffffffffbb0.impl_,
                 (type_conflict)((ulong)in_stack_fffffffffffffba0 >> 0x20));
      condition_02.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffbcc;
      condition_02.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffbc8;
      else_expr_02.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffbbc;
      else_expr_02.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffbb8;
      mp::BasicExprFactory<std::allocator<char>_>::MakeImplication
                ((BasicExprFactory<std::allocator<char>_> *)in_stack_fffffffffffffbb0.impl_,
                 condition_02,(LogicalExpr)in_stack_fffffffffffffbc0.impl_,else_expr_02);
    }
    testing::AssertionResult::operator<<
              (in_stack_fffffffffffffbd0,
               (char (*) [148])CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    local_20c = 3;
    std::__cxx11::string::~string(local_260);
    if (local_20c == 0) goto LAB_0012d91f;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffbd0);
  in_stack_fffffffffffffba8 =
       (BasicExprFactory<std::allocator<char>_> *)
       testing::AssertionResult::failure_message((AssertionResult *)0x12d877);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc,
             (char *)in_stack_fffffffffffffbc0.impl_,in_stack_fffffffffffffbbc,
             (char *)in_stack_fffffffffffffbb0.impl_);
  testing::internal::AssertHelper::operator=
            (in_stack_fffffffffffffc20,(Message *)in_stack_fffffffffffffc18);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffba0);
  testing::Message::~Message((Message *)0x12d8d4);
LAB_0012d91f:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12d92c);
  tVar2 = (type_conflict)((ulong)(in_RDI + 0x10) >> 0x20);
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffba8,
             (LogicalConstant)in_stack_fffffffffffffbb0.impl_,tVar2);
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffba8,
             (LogicalConstant)in_stack_fffffffffffffbb0.impl_,tVar2);
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)0x12d998);
  condition_03.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffbcc;
  condition_03.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffbc8;
  else_expr_03.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffbbc;
  else_expr_03.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffbb8;
  mp::BasicExprFactory<std::allocator<char>_>::MakeImplication
            ((BasicExprFactory<std::allocator<char>_> *)in_stack_fffffffffffffbb0.impl_,condition_03
             ,(LogicalExpr)in_stack_fffffffffffffbc0.impl_,else_expr_03);
  return;
}

Assistant:

TEST_F(ExprTest, ImplicationExpr) {
  mp::ImplicationExpr e;
  (void)LogicalExpr(e);
  EXPECT_TRUE(e == 0);
  auto condition = factory_.MakeLogicalConstant(true);
  auto then_expr = factory_.MakeLogicalConstant(false);
  auto else_expr = factory_.MakeLogicalConstant(true);
  e = factory_.MakeImplication(condition, then_expr, else_expr);
  EXPECT_TRUE(e != 0);
  EXPECT_EQ(expr::IMPLICATION, e.kind());
  EXPECT_EQ(condition, e.condition());
  EXPECT_EQ(then_expr, e.then_expr());
  EXPECT_EQ(else_expr, e.else_expr());
  EXPECT_ASSERT(factory_.MakeImplication(
                  LogicalExpr(), then_expr, else_expr),
                "invalid argument");
  EXPECT_ASSERT(factory_.MakeImplication(
                  condition, LogicalExpr(), else_expr),
                "invalid argument");
  factory_.MakeImplication(condition, then_expr, LogicalExpr());
}